

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkNullCoalescingPriority(CheckerVisitor *this,BinExpr *expr)

{
  TreeOp TVar1;
  Node *n;
  Node *n_00;
  char *pcVar2;
  
  if ((this->effectsOnly == false) && ((expr->super_Expr).super_Node._op == TO_NULLC)) {
    n = &expr->_lhs->super_Node;
    n_00 = &expr->_rhs->super_Node;
    TVar1 = n->_op;
    if (((ulong)TVar1 < 0x33) && ((0x403ffffe00000U >> ((ulong)TVar1 & 0x3f) & 1) != 0)) {
      pcVar2 = treeopStr(TVar1);
      report(this,n,0x5b,pcVar2);
    }
    TVar1 = n_00->_op;
    if (((ulong)TVar1 < 0x33) && ((0x403ffffe00000U >> ((ulong)TVar1 & 0x3f) & 1) != 0)) {
      pcVar2 = treeopStr(TVar1);
      report(this,n_00,0x5b,pcVar2);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkNullCoalescingPriority(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_NULLC) {
    if (isSuspiciousNeighborOfNullCoalescing(l->op())) {
      report(l, DiagnosticsId::DI_NULL_COALESCING_PRIORITY, treeopStr(l->op()));
    }

    if (isSuspiciousNeighborOfNullCoalescing(r->op())) {
      report(r, DiagnosticsId::DI_NULL_COALESCING_PRIORITY, treeopStr(r->op()));
    }
  }
}